

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

SupportVectorClassifier * __thiscall
CoreML::Specification::Model::mutable_supportvectorclassifier(Model *this)

{
  SupportVectorClassifier *this_00;
  
  if (this->_oneof_case_[0] == 0x191) {
    this_00 = (SupportVectorClassifier *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x191;
    this_00 = (SupportVectorClassifier *)operator_new(0xb0);
    SupportVectorClassifier::SupportVectorClassifier(this_00);
    (this->Type_).supportvectorclassifier_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::SupportVectorClassifier* Model::mutable_supportvectorclassifier() {
  if (!has_supportvectorclassifier()) {
    clear_Type();
    set_has_supportvectorclassifier();
    Type_.supportvectorclassifier_ = new ::CoreML::Specification::SupportVectorClassifier;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.supportVectorClassifier)
  return Type_.supportvectorclassifier_;
}